

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ClipLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_clip(NeuralNetworkLayer *this)

{
  bool bVar1;
  ClipLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_clip(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_clip(this);
    this_00 = (ClipLayerParams *)operator_new(0x20);
    ClipLayerParams::ClipLayerParams(this_00);
    (this->layer_).clip_ = this_00;
  }
  return (ClipLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ClipLayerParams* NeuralNetworkLayer::mutable_clip() {
  if (!has_clip()) {
    clear_layer();
    set_has_clip();
    layer_.clip_ = new ::CoreML::Specification::ClipLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.clip)
  return layer_.clip_;
}